

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mul.c
# Opt level: O1

void bn_mul_high(unsigned_long *r,unsigned_long *a,unsigned_long *b,unsigned_long *l,int n2,
                unsigned_long *t)

{
  unsigned_long *b_00;
  unsigned_long *a_00;
  ulong *rp;
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  ulong *puVar7;
  long lVar8;
  unsigned_long *puVar9;
  uint uVar10;
  long lVar11;
  ulong *ap;
  uint uVar12;
  ulong uVar13;
  int n;
  bool bVar14;
  
  n = n2 / 2;
  lVar11 = (long)n;
  b_00 = a + lVar11;
  iVar1 = bn_cmp_words(a,b_00,n);
  a_00 = b + lVar11;
  iVar2 = bn_cmp_words(a_00,b,n);
  bVar14 = true;
  switch(iVar2 + iVar1 * 3) {
  case 2:
    bn_sub_words(r,a,b_00,n);
    puVar9 = a_00;
LAB_00114e70:
    bn_sub_words(r + lVar11,b,puVar9,n);
    bVar14 = false;
    goto LAB_00114ec6;
  case 4:
    bn_sub_words(r,a,b_00,n);
    puVar9 = b;
    b = a_00;
    break;
  case -4:
    bn_sub_words(r,b_00,a,n);
    puVar9 = a_00;
    break;
  default:
    goto LAB_00114ec6;
  case -2:
    bn_sub_words(r,b_00,a,n);
    puVar9 = b;
    b = a_00;
    goto LAB_00114e70;
  }
  bn_sub_words(r + lVar11,b,puVar9,n);
LAB_00114ec6:
  puVar7 = r + lVar11;
  if ((n2 & 0xfffffffeU) == 0x10) {
    bn_mul_comba8(t,r,puVar7);
    bn_mul_comba8(r,b_00,a_00);
  }
  else {
    bn_mul_recursive(t,r,puVar7,n,0,0,t + n2);
    bn_mul_recursive(r,b_00,a_00,n,0,0,t + n2);
  }
  puVar6 = r;
  if (l != (unsigned_long *)0x0) {
    puVar6 = t + (n + n2);
    bn_add_words(puVar6,r,l,n);
  }
  rp = t + n2;
  if (bVar14) {
    bn_add_words(rp,puVar6,t,n);
  }
  else {
    bn_sub_words(rp,puVar6,t,n);
  }
  puVar6 = t + (n + n2);
  if (l == (unsigned_long *)0x0) {
    if (1 < n2) {
      lVar8 = 0;
      do {
        puVar6[lVar8] = -t[n2 + lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar11 != lVar8);
    }
  }
  else {
    bn_sub_words(puVar6,l + lVar11,rp,n);
  }
  if (l == (unsigned_long *)0x0) {
    iVar1 = 0;
    ap = puVar6;
  }
  else {
    uVar3 = bn_add_words(rp,puVar6,l,n);
    iVar1 = (int)uVar3;
    ap = rp;
  }
  uVar3 = bn_add_words(rp,ap,r,n);
  if (bVar14) {
    uVar4 = bn_add_words(rp,rp,t,n);
    iVar2 = (int)uVar4;
  }
  else {
    uVar4 = bn_sub_words(rp,rp,t,n);
    iVar2 = -(int)uVar4;
  }
  uVar12 = (int)uVar3 + iVar1 + iVar2;
  uVar13 = (ulong)uVar12;
  uVar3 = bn_add_words(r,r,puVar6,n);
  uVar4 = bn_add_words(r,r,puVar7,n);
  if (bVar14) {
    uVar5 = bn_add_words(r,r,t + lVar11,n);
    iVar1 = (int)uVar5;
  }
  else {
    uVar5 = bn_sub_words(r,r,t + lVar11,n);
    iVar1 = -(int)uVar5;
  }
  uVar10 = (int)uVar4 + (int)uVar3 + iVar1;
  uVar3 = (ulong)uVar10;
  if (uVar12 != 0) {
    puVar6 = r;
    if ((int)uVar12 < 1) {
      uVar4 = (ulong)-uVar12;
      do {
        bVar14 = *puVar6 < uVar4;
        *puVar6 = *puVar6 - uVar4;
        puVar6 = puVar6 + 1;
        uVar4 = (ulong)bVar14;
      } while (bVar14);
    }
    else {
      do {
        bVar14 = CARRY8(*puVar6,uVar13);
        *puVar6 = *puVar6 + uVar13;
        uVar13 = (ulong)bVar14;
        puVar6 = puVar6 + 1;
      } while (bVar14);
    }
  }
  if (uVar10 != 0) {
    if ((int)uVar10 < 1) {
      uVar3 = (ulong)-uVar10;
      do {
        bVar14 = *puVar7 < uVar3;
        *puVar7 = *puVar7 - uVar3;
        puVar7 = puVar7 + 1;
        uVar3 = (ulong)bVar14;
      } while (bVar14);
    }
    else {
      puVar7 = r + lVar11;
      do {
        bVar14 = CARRY8(*puVar7,uVar3);
        *puVar7 = *puVar7 + uVar3;
        puVar7 = puVar7 + 1;
        uVar3 = (ulong)bVar14;
      } while (bVar14);
    }
  }
  return;
}

Assistant:

void bn_mul_high(BN_ULONG *r, BN_ULONG *a, BN_ULONG *b, BN_ULONG *l, int n2,
                 BN_ULONG *t)
{
    int i, n;
    int c1, c2;
    int neg, oneg, zero;
    BN_ULONG ll, lc, *lp, *mp;

    n = n2 / 2;

    /* Calculate (al-ah)*(bh-bl) */
    neg = zero = 0;
    c1 = bn_cmp_words(&(a[0]), &(a[n]), n);
    c2 = bn_cmp_words(&(b[n]), &(b[0]), n);
    switch (c1 * 3 + c2) {
    case -4:
        bn_sub_words(&(r[0]), &(a[n]), &(a[0]), n);
        bn_sub_words(&(r[n]), &(b[0]), &(b[n]), n);
        break;
    case -3:
        zero = 1;
        break;
    case -2:
        bn_sub_words(&(r[0]), &(a[n]), &(a[0]), n);
        bn_sub_words(&(r[n]), &(b[n]), &(b[0]), n);
        neg = 1;
        break;
    case -1:
    case 0:
    case 1:
        zero = 1;
        break;
    case 2:
        bn_sub_words(&(r[0]), &(a[0]), &(a[n]), n);
        bn_sub_words(&(r[n]), &(b[0]), &(b[n]), n);
        neg = 1;
        break;
    case 3:
        zero = 1;
        break;
    case 4:
        bn_sub_words(&(r[0]), &(a[0]), &(a[n]), n);
        bn_sub_words(&(r[n]), &(b[n]), &(b[0]), n);
        break;
    }

    oneg = neg;
    /* t[10] = (a[0]-a[1])*(b[1]-b[0]) */
    /* r[10] = (a[1]*b[1]) */
# ifdef BN_MUL_COMBA
    if (n == 8) {
        bn_mul_comba8(&(t[0]), &(r[0]), &(r[n]));
        bn_mul_comba8(r, &(a[n]), &(b[n]));
    } else
# endif
    {
        bn_mul_recursive(&(t[0]), &(r[0]), &(r[n]), n, 0, 0, &(t[n2]));
        bn_mul_recursive(r, &(a[n]), &(b[n]), n, 0, 0, &(t[n2]));
    }

    /*-
     * s0 == low(al*bl)
     * s1 == low(ah*bh)+low((al-ah)*(bh-bl))+low(al*bl)+high(al*bl)
     * We know s0 and s1 so the only unknown is high(al*bl)
     * high(al*bl) == s1 - low(ah*bh+s0+(al-ah)*(bh-bl))
     * high(al*bl) == s1 - (r[0]+l[0]+t[0])
     */
    if (l != NULL) {
        lp = &(t[n2 + n]);
        bn_add_words(lp, &(r[0]), &(l[0]), n);
    } else {
        lp = &(r[0]);
    }

    if (neg)
        neg = (int)(bn_sub_words(&(t[n2]), lp, &(t[0]), n));
    else {
        bn_add_words(&(t[n2]), lp, &(t[0]), n);
        neg = 0;
    }

    if (l != NULL) {
        bn_sub_words(&(t[n2 + n]), &(l[n]), &(t[n2]), n);
    } else {
        lp = &(t[n2 + n]);
        mp = &(t[n2]);
        for (i = 0; i < n; i++)
            lp[i] = ((~mp[i]) + 1) & BN_MASK2;
    }

    /*-
     * s[0] = low(al*bl)
     * t[3] = high(al*bl)
     * t[10] = (a[0]-a[1])*(b[1]-b[0]) neg is the sign
     * r[10] = (a[1]*b[1])
     */
    /*-
     * R[10] = al*bl
     * R[21] = al*bl + ah*bh + (a[0]-a[1])*(b[1]-b[0])
     * R[32] = ah*bh
     */
    /*-
     * R[1]=t[3]+l[0]+r[0](+-)t[0] (have carry/borrow)
     * R[2]=r[0]+t[3]+r[1](+-)t[1] (have carry/borrow)
     * R[3]=r[1]+(carry/borrow)
     */
    if (l != NULL) {
        lp = &(t[n2]);
        c1 = (int)(bn_add_words(lp, &(t[n2 + n]), &(l[0]), n));
    } else {
        lp = &(t[n2 + n]);
        c1 = 0;
    }
    c1 += (int)(bn_add_words(&(t[n2]), lp, &(r[0]), n));
    if (oneg)
        c1 -= (int)(bn_sub_words(&(t[n2]), &(t[n2]), &(t[0]), n));
    else
        c1 += (int)(bn_add_words(&(t[n2]), &(t[n2]), &(t[0]), n));

    c2 = (int)(bn_add_words(&(r[0]), &(r[0]), &(t[n2 + n]), n));
    c2 += (int)(bn_add_words(&(r[0]), &(r[0]), &(r[n]), n));
    if (oneg)
        c2 -= (int)(bn_sub_words(&(r[0]), &(r[0]), &(t[n]), n));
    else
        c2 += (int)(bn_add_words(&(r[0]), &(r[0]), &(t[n]), n));

    if (c1 != 0) {              /* Add starting at r[0], could be +ve or -ve */
        i = 0;
        if (c1 > 0) {
            lc = c1;
            do {
                ll = (r[i] + lc) & BN_MASK2;
                r[i++] = ll;
                lc = (lc > ll);
            } while (lc);
        } else {
            lc = -c1;
            do {
                ll = r[i];
                r[i++] = (ll - lc) & BN_MASK2;
                lc = (lc > ll);
            } while (lc);
        }
    }
    if (c2 != 0) {              /* Add starting at r[1] */
        i = n;
        if (c2 > 0) {
            lc = c2;
            do {
                ll = (r[i] + lc) & BN_MASK2;
                r[i++] = ll;
                lc = (lc > ll);
            } while (lc);
        } else {
            lc = -c2;
            do {
                ll = r[i];
                r[i++] = (ll - lc) & BN_MASK2;
                lc = (lc > ll);
            } while (lc);
        }
    }
}